

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide_device.cpp
# Opt level: O2

void embree::initializeClothPositions(ClothModel *cloth)

{
  vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_> *__x;
  pointer pVVar1;
  long lVar2;
  pointer pVVar3;
  ulong uVar4;
  long lVar5;
  size_t j;
  ulong uVar6;
  
  if (DAT_002b0d70 != sim_collisions) {
    DAT_002b0d70 = sim_collisions;
  }
  __x = &cloth->x_0_;
  lVar2 = 0;
  for (uVar4 = 0; uVar4 < NX; uVar4 = uVar4 + 1) {
    lVar5 = 8;
    for (uVar6 = 0; uVar6 < NZ; uVar6 = uVar6 + 1) {
      *(float *)((long)(__x->super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>).
                       _M_impl.super__Vector_impl_data._M_start + lVar5 + -8 + NX * lVar2) =
           (5.0 / (float)(NX - 1)) * (float)uVar4 + -2.5;
      *(undefined4 *)
       ((long)(__x->super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>)._M_impl.
              super__Vector_impl_data._M_start + lVar5 + -4 + NX * lVar2) = 0x3fc00000;
      *(float *)((long)&((__x->super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>).
                         _M_impl.super__Vector_impl_data._M_start)->field_0 + lVar5 + NX * lVar2) =
           (float)uVar6 * (5.0 / (float)(NZ - 1)) + -2.5;
      lVar5 = lVar5 + 0x10;
    }
    lVar2 = lVar2 + 0x10;
  }
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator=
            (&(cloth->super_Mesh).x_,__x);
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator=(&cloth->x_old_,__x);
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator=(&cloth->x_last_,__x);
  pVVar1 = (cloth->v_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pVVar3 = (cloth->v_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>.
                _M_impl.super__Vector_impl_data._M_start; pVVar3 != pVVar1; pVVar3 = pVVar3 + 1) {
    *(undefined8 *)&pVVar3->field_0 = 0;
    *(undefined8 *)((long)&pVVar3->field_0 + 8) = 0;
  }
  cur_time = 0;
  collide2::ClothModel::clearCollisionConstraints(cloth);
  return;
}

Assistant:

void initializeClothPositions (collide2::ClothModel & cloth) {

  sim_collisions.clear();

  for (size_t i=0; i<NX; ++i) {
    for (size_t j=0; j<NZ; ++j) {
      cloth.x_0_[NX*i+j].x = -(.5f*width) + (float)i*(width/(float)(NX-1));
      cloth.x_0_[NX*i+j].y = +1.5f;
      cloth.x_0_[NX*i+j].z = -(.5f*height) + (float)j*(height/(float)(NZ-1));
    }
  }
  cloth.x_ = cloth.x_0_;
  cloth.x_old_ = cloth.x_0_;
  cloth.x_last_ = cloth.x_0_;
  collide2::vec_t nullvec(0.f, 0.f, 0.f);
  std::fill (cloth.v_.begin (), cloth.v_.end (), nullvec);

  cur_time = 0;
  cloth.clearCollisionConstraints();
}